

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void copy_suite::expand_copy_n(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  view_pointer pcVar2;
  circular_view<int,_18446744073709551615UL> *pcVar3;
  ulong uVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> __result;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> input;
  int array [4];
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  circular_view<int,_18446744073709551615UL> local_90;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  type local_28 [6];
  
  local_90.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_90.member.cap = 4;
  local_90.member.size = 0;
  local_90.member.next = 4;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x160000000b;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_58);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_90,4);
  local_58 = 0;
  uStack_50 = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_00,&local_a9);
  uVar1 = local_90.member.cap * 2;
  if ((uVar1 & local_90.member.cap * 2 - 1) == 0) {
    uVar4 = local_90.member.next - local_90.member.size & uVar1 - 1;
    sStack_30 = uVar1 - 1 & local_90.member.next;
  }
  else {
    uVar4 = (local_90.member.next - local_90.member.size) % uVar1;
    sStack_30 = local_90.member.next % uVar1;
  }
  first_end.current = sStack_30;
  first_end.parent = &local_90;
  first_begin.current = uVar4;
  first_begin.parent = &local_90;
  pcVar3 = &local_90;
  local_38 = &local_90;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x4a,"void copy_suite::expand_copy_n()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar1 = local_90.member.cap * 2;
  if ((uVar1 & local_90.member.cap * 2 - 1) == 0) {
    pcVar2 = (view_pointer)(uVar1 - 1 & local_90.member.next - local_90.member.size);
  }
  else {
    pcVar2 = (view_pointer)((local_90.member.next - local_90.member.size) % uVar1);
  }
  if (local_90.member.size != 0) {
    __result.current = (size_type)pcVar3;
    __result.parent = pcVar2;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<int*,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
              ((__copy_move<false,false,std::random_access_iterator_tag> *)
               local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (int *)((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + local_90.member.size * 4),
               (int *)&local_90,__result);
  }
  local_58 = 0x160000000b;
  uStack_50 = 0x2c00000021;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,__l_01,&local_a9);
  uVar1 = local_90.member.cap * 2;
  if ((uVar1 & local_90.member.cap * 2 - 1) == 0) {
    uVar4 = local_90.member.next - local_90.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_90.member.next;
  }
  else {
    uVar4 = (local_90.member.next - local_90.member.size) % uVar1;
    sStack_40 = local_90.member.next % uVar1;
  }
  first_end_00.current = sStack_40;
  first_end_00.parent = &local_90;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_90;
  local_48 = &local_90;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x50,"void copy_suite::expand_copy_n()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((__copy_move<false,false,std::random_access_iterator_tag> *)
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (__copy_move<false,false,std::random_access_iterator_tag> *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_copy_n()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::vector<int> input = { 11, 22, 33, 44, 55 };
    span.expand_back(span.capacity());
    {
        std::vector<int> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    std::copy_n(input.begin(), span.size(), span.begin());
    {
        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}